

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

void __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::GetBlocksOut(CFG::Block*,wasm::InsertOrderedSet<CFG
::Block*>&,wasm::InsertOrderedSet<CFG::Block_>__
          (void *this,Block *Source,BlockSet *Entries,BlockSet *LimitTo)

{
  bool bVar1;
  reference __in;
  type *contained;
  type *_;
  type *CurrBlock;
  _Self local_40;
  iterator __end2;
  iterator __begin2;
  BlockBranchMap *__range2;
  BlockSet *LimitTo_local;
  BlockSet *Entries_local;
  Block *Source_local;
  Analyzer *this_local;
  
  __end2 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::begin(&Source->BranchesOut);
  local_40._M_node =
       (_List_node_base *)
       ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end(&Source->BranchesOut);
  while (bVar1 = std::operator!=(&__end2,&local_40), bVar1) {
    __in = std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator*(&__end2);
    contained = std::get<0ul,CFG::Block*const,CFG::Branch*>(__in);
    std::get<1ul,CFG::Block*const,CFG::Branch*>(__in);
    if ((LimitTo == (BlockSet *)0x0) ||
       (bVar1 = contains<wasm::InsertOrderedSet<CFG::Block*>,CFG::Block*>(LimitTo,contained), bVar1)
       ) {
      ::wasm::InsertOrderedSet<CFG::Block_*>::insert(Entries,contained);
    }
    std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator++(&__end2);
  }
  return;
}

Assistant:

void GetBlocksOut(Block* Source,
                      BlockSet& Entries,
                      BlockSet* LimitTo = nullptr) {
      for (auto& [CurrBlock, _] : Source->BranchesOut) {
        if (!LimitTo || contains(*LimitTo, CurrBlock)) {
          Entries.insert(CurrBlock);
        }
      }
    }